

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O0

uint64_t websocket_client_wrap
                   (void *target,void *msg,uint64_t len,uchar opcode,uchar first,uchar last,
                   uchar rsv)

{
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  undefined1 local_4c;
  undefined1 local_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  uint32_t mask;
  uchar last_local;
  uchar first_local;
  uchar opcode_local;
  uint64_t len_local;
  void *msg_local;
  void *target_local;
  
  uVar3 = rand();
  uVar3 = uVar3 | 0x1020408;
  local_4c = opcode;
  if (first == '\0') {
    local_4c = 0;
  }
  *(byte *)target = local_4c & 0xf | (rsv & 7) << 4 | last << 7;
  uStack_2f = (undefined1)(uVar3 >> 8);
  uStack_2e = (undefined1)(uVar3 >> 0x10);
  uStack_2d = (undefined1)(uVar3 >> 0x18);
  bVar1 = (byte)len;
  local_30 = (undefined1)uVar3;
  if (len < 0x7e) {
    *(byte *)((long)target + 1) = bVar1 | 0x80;
    *(undefined1 *)((long)target + 2) = local_30;
    *(undefined1 *)((long)target + 3) = uStack_2f;
    *(undefined1 *)((long)target + 4) = uStack_2e;
    *(undefined1 *)((long)target + 5) = uStack_2d;
    memcpy((void *)((long)target + 6),msg,len);
    websocket_xmask((void *)((long)target + 6),len,uVar3);
    target_local = (void *)(len + 6);
  }
  else {
    uVar2 = (undefined1)(len >> 8);
    if (len < 0x10000) {
      *(undefined1 *)((long)target + 1) = 0xfe;
      *(undefined1 *)((long)target + 2) = uVar2;
      *(byte *)((long)target + 3) = bVar1;
      *(undefined1 *)((long)target + 4) = local_30;
      *(undefined1 *)((long)target + 5) = uStack_2f;
      *(undefined1 *)((long)target + 6) = uStack_2e;
      *(undefined1 *)((long)target + 7) = uStack_2d;
      memcpy((void *)((long)target + 8),msg,len);
      websocket_xmask((void *)((long)target + 8),len,uVar3);
      target_local = (void *)(len + 8);
    }
    else {
      *(undefined1 *)((long)target + 1) = 0xff;
      *(char *)((long)target + 2) = (char)(len >> 0x38);
      *(char *)((long)target + 3) = (char)(len >> 0x30);
      *(char *)((long)target + 4) = (char)(len >> 0x28);
      *(char *)((long)target + 5) = (char)(len >> 0x20);
      *(char *)((long)target + 6) = (char)(len >> 0x18);
      *(char *)((long)target + 7) = (char)(len >> 0x10);
      *(undefined1 *)((long)target + 8) = uVar2;
      *(byte *)((long)target + 9) = bVar1;
      *(undefined1 *)((long)target + 10) = local_30;
      *(undefined1 *)((long)target + 0xb) = uStack_2f;
      *(undefined1 *)((long)target + 0xc) = uStack_2e;
      *(undefined1 *)((long)target + 0xd) = uStack_2d;
      memcpy((void *)((long)target + 0xe),msg,len);
      websocket_xmask((void *)((long)target + 0xe),len,uVar3);
      target_local = (void *)(len + 0xe);
    }
  }
  return (uint64_t)target_local;
}

Assistant:

static uint64_t websocket_client_wrap(void *target, void *msg, uint64_t len,
                                      unsigned char opcode, unsigned char first,
                                      unsigned char last, unsigned char rsv) {
  uint32_t mask = rand() | 0x01020408;
  ((uint8_t *)target)[0] = 0 |
                           /* opcode */ (((first ? opcode : 0) & 15)) |
                           /* rsv */ ((rsv & 7) << 4) |
                           /*fin*/ ((last & 1) << 7);
  if (len < 126) {
    ((uint8_t *)target)[1] = len | 128;
    ((uint8_t *)target)[2] = ((uint8_t *)(&mask))[0];
    ((uint8_t *)target)[3] = ((uint8_t *)(&mask))[1];
    ((uint8_t *)target)[4] = ((uint8_t *)(&mask))[2];
    ((uint8_t *)target)[5] = ((uint8_t *)(&mask))[3];
    memcpy(((uint8_t *)target) + 6, msg, len);
    websocket_xmask((uint8_t *)target + 6, len, mask);
    return len + 6;
  } else if (len < (1UL << 16)) {
    /* head is 4 bytes */
    ((uint8_t *)target)[1] = 126 | 128;
    websocket_u2str16(((uint8_t *)target + 2), len);
    ((uint8_t *)target)[4] = ((uint8_t *)(&mask))[0];
    ((uint8_t *)target)[5] = ((uint8_t *)(&mask))[1];
    ((uint8_t *)target)[6] = ((uint8_t *)(&mask))[2];
    ((uint8_t *)target)[7] = ((uint8_t *)(&mask))[3];
    memcpy((uint8_t *)target + 8, msg, len);
    websocket_xmask((uint8_t *)target + 8, len, mask);
    return len + 8;
  }
  /* Really Long Message  */
  ((uint8_t *)target)[1] = 255;
  websocket_u2str64(((uint8_t *)target + 2), len);
  ((uint8_t *)target)[10] = ((uint8_t *)(&mask))[0];
  ((uint8_t *)target)[11] = ((uint8_t *)(&mask))[1];
  ((uint8_t *)target)[12] = ((uint8_t *)(&mask))[2];
  ((uint8_t *)target)[13] = ((uint8_t *)(&mask))[3];
  memcpy((uint8_t *)target + 14, msg, len);
  websocket_xmask((uint8_t *)target + 14, len, mask);
  return len + 14;
}